

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderImageLoadStoreTests.cpp
# Opt level: O1

string * __thiscall
deqp::gles31::Functional::arrayStr<int,5>
          (string *__return_storage_ptr__,Functional *this,int (*arr) [5])

{
  long *plVar1;
  char *pcVar2;
  long *plVar3;
  long lVar4;
  long *local_1e8;
  long local_1d8;
  long lStack_1d0;
  long *local_1c8 [2];
  long local_1b8 [2];
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"{ ","");
  lVar4 = 0;
  do {
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    std::ostream::operator<<(local_1a8,*(int *)(this + lVar4 * 4));
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream(local_1a8);
    std::ios_base::~ios_base(local_138);
    pcVar2 = ", ";
    if (lVar4 == 0) {
      pcVar2 = "";
    }
    plVar1 = (long *)std::__cxx11::string::replace((ulong)local_1c8,0,(char *)0x0,(ulong)pcVar2);
    plVar3 = plVar1 + 2;
    if ((long *)*plVar1 == plVar3) {
      local_1d8 = *plVar3;
      lStack_1d0 = plVar1[3];
      local_1e8 = &local_1d8;
    }
    else {
      local_1d8 = *plVar3;
      local_1e8 = (long *)*plVar1;
    }
    *plVar1 = (long)plVar3;
    plVar1[1] = 0;
    *(undefined1 *)(plVar1 + 2) = 0;
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_1e8);
    if (local_1e8 != &local_1d8) {
      operator_delete(local_1e8,local_1d8 + 1);
    }
    if (local_1c8[0] != local_1b8) {
      operator_delete(local_1c8[0],local_1b8[0] + 1);
    }
    lVar4 = lVar4 + 1;
  } while (lVar4 != 5);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

static string arrayStr (const T (&arr)[Size])
{
	string result = "{ ";
	for (int i = 0; i < Size; i++)
		result += (i > 0 ? ", " : "") + toString(arr[i]);
	result += " }";
	return result;
}